

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

bool __thiscall
chrono::ChOptimizerGenetic::DeletePopulation
          (ChOptimizerGenetic *this,ChGenotype ***my_population,int my_popsize)

{
  ChGenotype **ppCVar1;
  ChGenotype *this_00;
  ulong uVar2;
  
  ppCVar1 = *my_population;
  if (ppCVar1 != (ChGenotype **)0x0) {
    for (uVar2 = 0; (uint)(~(my_popsize >> 0x1f) & my_popsize) != uVar2; uVar2 = uVar2 + 1) {
      this_00 = (*my_population)[uVar2];
      if (this_00 != (ChGenotype *)0x0) {
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)this_00);
      }
      ::operator_delete(this_00,0x30);
    }
    free(*my_population);
    *my_population = (ChGenotype **)0x0;
  }
  return ppCVar1 != (ChGenotype **)0x0;
}

Assistant:

bool ChOptimizerGenetic::DeletePopulation(ChGenotype**& my_population, int my_popsize) {
    if (my_population == NULL)
        return false;

    // delete all the individuals (the genotypes)
    ChGenotype* mygen;
    for (int i = 0; i < my_popsize; i++) {
        mygen = my_population[i];
        delete (mygen);
    }

    // delete the array of pointers
    free(my_population);
    my_population = NULL;

    return true;
}